

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimer.cpp
# Opt level: O2

void __thiscall QTimer::QTimer(QTimer *this,QObject *parent)

{
  QTimerPrivate *this_00;
  
  (this->super_QObject)._vptr_QObject = (_func_int **)&PTR_metaObject_00666290;
  this_00 = (QTimerPrivate *)operator_new(0xa8);
  QTimerPrivate::QTimerPrivate(this_00,this);
  QObject::QObject(&this->super_QObject,(QObjectPrivate *)this_00,parent);
  (this->super_QObject)._vptr_QObject = (_func_int **)&PTR_metaObject_00666290;
  return;
}

Assistant:

QTimer::QTimer(QObject *parent)
    : QObject(*new QTimerPrivate(this), parent)
{
    Q_ASSERT(d_func()->isQTimer);
}